

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_coordinator_unittest.cpp
# Opt level: O2

void __thiscall
HostCoordinator_baserange_alloc_free_Test::~HostCoordinator_baserange_alloc_free_Test
          (HostCoordinator_baserange_alloc_free_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HostCoordinator, baserange_alloc_free) {
    using namespace memory;

    typedef HostCoordinator<int> intcoord_t;
    intcoord_t coordinator;

    auto rng = coordinator.allocate(5);
    typedef decltype(rng) rng_t;

    intcoord_t coord;

    // test that range is a base range
    EXPECT_TRUE(impl::is_array_view<rng_t>::value);

    // test that range has correct storage type
    ::testing::StaticAssertTypeEq<int, rng_t::value_type >();

    // verify that the range has non-NULL pointer
    EXPECT_NE(rng_t::pointer(0), rng.data()) << "HostCoordinator returned a NULL pointer when alloating a nonzero range";

    // verify that freeing works
    coordinator.free(rng);

    EXPECT_EQ(rng_t::pointer(0), rng.data());
    EXPECT_EQ(rng_t::size_type(0), rng.size());
}